

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_portable.h
# Opt level: O2

void __thiscall
highwayhash::Portable::HHStatePortable::UpdateRemainder
          (HHStatePortable *this,char *bytes,size_t size_mod32)

{
  int lane;
  long lVar1;
  char *buffer;
  ulong uVar2;
  HHPacket packet;
  size_t sStack_a8;
  uint64_t local_88;
  char local_80 [80];
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->v0[lVar1] = this->v0[lVar1] + size_mod32 * 0x100000001;
  }
  Rotate32By((uint32_t *)this->v1,size_mod32);
  uVar2 = (ulong)((uint)size_mod32 & 3);
  local_80[0x10] = '\0';
  local_80[0x11] = '\0';
  local_80[0x12] = '\0';
  local_80[0x13] = '\0';
  local_80[0x14] = '\0';
  local_80[0x15] = '\0';
  local_80[0x16] = '\0';
  local_80[0x17] = '\0';
  local_80[0x18] = '\0';
  local_80[0x19] = '\0';
  local_80[0x1a] = '\0';
  local_80[0x1b] = '\0';
  local_80[0x1c] = '\0';
  local_80[0x1d] = '\0';
  local_80[0x1e] = '\0';
  local_80[0x1f] = '\0';
  local_80[0] = '\0';
  local_80[1] = '\0';
  local_80[2] = '\0';
  local_80[3] = '\0';
  local_80[4] = '\0';
  local_80[5] = '\0';
  local_80[6] = '\0';
  local_80[7] = '\0';
  local_80[8] = '\0';
  local_80[9] = '\0';
  local_80[10] = '\0';
  local_80[0xb] = '\0';
  local_80[0xc] = '\0';
  local_80[0xd] = '\0';
  local_80[0xe] = '\0';
  local_80[0xf] = '\0';
  CopyPartial(bytes,size_mod32 & 0xfffffffffffffffc,local_80);
  if ((size_mod32 & 0x10) == 0) {
    local_88 = Load3::operator()((Load3 *)&local_88,bytes + (size_mod32 & 0xfffffffffffffffc),uVar2)
    ;
    buffer = local_80 + 0x10;
    sStack_a8 = 8;
  }
  else {
    local_88 = CONCAT44(local_88._4_4_,
                        *(undefined4 *)(bytes + (size_mod32 & 0xfffffffffffffffc) + (uVar2 - 4)));
    buffer = local_80 + 0x1c;
    sStack_a8 = 4;
  }
  CopyPartial((char *)&local_88,sStack_a8,buffer);
  Update(this,(HHPacket *)local_80);
  return;
}

Assistant:

HH_INLINE void UpdateRemainder(const char* bytes, const size_t size_mod32) {
    // 'Length padding' differentiates zero-valued inputs that have the same
    // size/32. mod32 is sufficient because each Update behaves as if a
    // counter were injected, because the state is large and mixed thoroughly.
    const uint64_t mod32_pair =
        (static_cast<uint64_t>(size_mod32) << 32) + size_mod32;
    for (int lane = 0; lane < kNumLanes; ++lane) {
      v0[lane] += mod32_pair;
    }
    Rotate32By(reinterpret_cast<uint32_t*>(&v1), size_mod32);

    const size_t size_mod4 = size_mod32 & 3;
    const char* remainder = bytes + (size_mod32 & ~3);

    HH_ALIGNAS(32) HHPacket packet = {0};
    CopyPartial(bytes, remainder - bytes, &packet[0]);

    if (size_mod32 & 16) {  // 16..31 bytes left
      // Read the last 0..3 bytes and previous 1..4 into the upper bits.
      // Insert into the upper four bytes of packet, which are zero.
      uint32_t last4 =
          Load3()(Load3::AllowReadBeforeAndReturn(), remainder, size_mod4);
      last4 = host_from_le32(last4);

      CopyPartial(reinterpret_cast<const char*>(&last4), 4, &packet[28]);
    } else {  // size_mod32 < 16
      uint64_t last4 = Load3()(Load3::AllowUnordered(), remainder, size_mod4);
      last4 = host_from_le64(last4);

      // Rather than insert at packet + 28, it is faster to initialize
      // the otherwise empty packet + 16 with up to 64 bits of padding.
      CopyPartial(reinterpret_cast<const char*>(&last4), sizeof(last4),
                  &packet[16]);
    }
    Update(packet);
  }